

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_4161a3::ForwardTemplateReference::hasRHSComponentSlow
          (ForwardTemplateReference *this,OutputStream *S)

{
  undefined1 local_30 [8];
  SwapAndRestore<bool> SavePrinting;
  OutputStream *S_local;
  ForwardTemplateReference *this_local;
  
  if ((this->Printing & 1U) == 0) {
    SavePrinting._8_8_ = S;
    SwapAndRestore<bool>::SwapAndRestore((SwapAndRestore<bool> *)local_30,&this->Printing,true);
    this_local._7_1_ = Node::hasRHSComponent(this->Ref,(OutputStream *)SavePrinting._8_8_);
    SwapAndRestore<bool>::~SwapAndRestore((SwapAndRestore<bool> *)local_30);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool hasRHSComponentSlow(OutputStream &S) const override {
    if (Printing)
      return false;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    return Ref->hasRHSComponent(S);
  }